

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

int dict_write(dict_t *dict,char *filename,char *format)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  char *__src;
  s3wid_t w;
  long lVar4;
  int iVar5;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                   ,0xe1,"Failed to open \'%s\'",filename);
    iVar1 = -1;
  }
  else {
    for (lVar4 = 0; lVar4 < dict->n_word; lVar4 = lVar4 + 1) {
      w = (s3wid_t)lVar4;
      iVar1 = dict_real_word(dict,w);
      if (iVar1 != 0) {
        iVar5 = 0;
        for (iVar1 = 0; iVar1 < dict->word[lVar4].pronlen; iVar1 = iVar1 + 1) {
          pcVar2 = dict_ciphone_str(dict,w,iVar1);
          sVar3 = strlen(pcVar2);
          iVar5 = iVar5 + (int)sVar3 + 1;
        }
        pcVar2 = (char *)__ckd_calloc__(1,(long)iVar5,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                                        ,0xeb);
        iVar1 = 0;
        while( true ) {
          if (dict->word[lVar4].pronlen <= iVar1) break;
          __src = dict_ciphone_str(dict,w,iVar1);
          strcat(pcVar2,__src);
          if (iVar1 != dict->word[lVar4].pronlen + -1) {
            sVar3 = strlen(pcVar2);
            (pcVar2 + sVar3)[0] = ' ';
            (pcVar2 + sVar3)[1] = '\0';
          }
          iVar1 = iVar1 + 1;
        }
        fprintf(__stream,"%-30s %s\n",dict->word[lVar4].word,pcVar2);
        ckd_free(pcVar2);
      }
    }
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dict_write(dict_t *dict, char const *filename, char const *format)
{
    FILE *fh;
    int i;

    (void)format; /* FIXME */
    if ((fh = fopen(filename, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open '%s'", filename);
        return -1;
    }
    for (i = 0; i < dict->n_word; ++i) {
        char *phones;
        int j, phlen;
        if (!dict_real_word(dict, i))
            continue;
        for (phlen = j = 0; j < dict_pronlen(dict, i); ++j)
            phlen += strlen(dict_ciphone_str(dict, i, j)) + 1;
        phones = ckd_calloc(1, phlen);
        for (j = 0; j < dict_pronlen(dict, i); ++j) {
            strcat(phones, dict_ciphone_str(dict, i, j));
            if (j != dict_pronlen(dict, i) - 1)
                strcat(phones, " ");
        }
        fprintf(fh, "%-30s %s\n", dict_wordstr(dict, i), phones);
        ckd_free(phones);
    }
    fclose(fh);
    return 0;
}